

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

void __thiscall
cfd::core::AbstractTransaction::AddTxOut
          (AbstractTransaction *this,Amount *value,Script *locking_script)

{
  wally_tx *tx;
  uint64_t satoshi;
  uchar *script;
  size_type script_len;
  CfdException *this_00;
  allocator local_a1;
  string local_a0;
  CfdSourceLocation local_80;
  int local_68 [2];
  int ret;
  ByteData local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *script_data;
  Script *locking_script_local;
  Amount *value_local;
  AbstractTransaction *this_local;
  
  script_data = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)locking_script;
  locking_script_local = (Script *)value;
  value_local = (Amount *)this;
  Script::GetData(&local_58,locking_script);
  ByteData::GetBytes(&local_40,&local_58);
  ByteData::~ByteData(&local_58);
  local_28 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40;
  tx = (wally_tx *)this->wally_tx_pointer_;
  satoshi = Amount::GetSatoshiValue((Amount *)locking_script_local);
  script = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_28);
  script_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_28);
  local_68[0] = wally_tx_add_raw_output(tx,satoshi,script,script_len,0);
  if (local_68[0] != 0) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction_common.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x222;
    local_80.funcname = "AddTxOut";
    logger::warn<int&>(&local_80,"wally_tx_add_raw_output NG[{}].",local_68);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_a0,"vout add error.",&local_a1);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_a0);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
  return;
}

Assistant:

void AbstractTransaction::AddTxOut(
    const Amount &value, const Script &locking_script) {
  const std::vector<uint8_t> &script_data =
      locking_script.GetData().GetBytes();
  int ret = wally_tx_add_raw_output(
      static_cast<struct wally_tx *>(wally_tx_pointer_),
      value.GetSatoshiValue(), script_data.data(), script_data.size(), 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_raw_output NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "vout add error.");
  }
}